

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O0

void __thiscall
pugi::impl::anon_unknown_0::xpath_node_set_raw::push_back_grow
          (xpath_node_set_raw *this,xpath_node *node,xpath_allocator *alloc)

{
  bool *pbVar1;
  void *pvVar2;
  ulong new_size;
  long lVar3;
  size_t in_RDX;
  undefined8 *in_RSI;
  xpath_allocator *in_RDI;
  xpath_node *data;
  size_t new_capacity;
  size_t capacity;
  
  new_size = (long)((long)in_RDI[1]._root - in_RDI->_root_size) >> 4;
  lVar3 = new_size + (new_size >> 1);
  pvVar2 = xpath_allocator::reallocate(in_RDI,in_RSI,in_RDX,new_size);
  if (pvVar2 != (void *)0x0) {
    in_RDI->_root_size = (size_t)pvVar2;
    in_RDI->_error = (bool *)((long)pvVar2 + new_size * 0x10);
    in_RDI[1]._root = (xpath_memory_block *)((long)pvVar2 + (lVar3 + 1) * 0x10);
    pbVar1 = in_RDI->_error;
    in_RDI->_error = pbVar1 + 0x10;
    *(undefined8 *)pbVar1 = *in_RSI;
    *(undefined8 *)(pbVar1 + 8) = in_RSI[1];
  }
  return;
}

Assistant:

PUGI__FN_NO_INLINE void xpath_node_set_raw::push_back_grow(const xpath_node& node, xpath_allocator* alloc)
	{
		size_t capacity = static_cast<size_t>(_eos - _begin);

		// get new capacity (1.5x rule)
		size_t new_capacity = capacity + capacity / 2 + 1;

		// reallocate the old array or allocate a new one
		xpath_node* data = static_cast<xpath_node*>(alloc->reallocate(_begin, capacity * sizeof(xpath_node), new_capacity * sizeof(xpath_node)));
		if (!data) return;

		// finalize
		_begin = data;
		_end = data + capacity;
		_eos = data + new_capacity;

		// push
		*_end++ = node;
	}